

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::
PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::dispatch
          (PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
           *this)

{
  bool bVar1;
  type local_b0;
  function<void_(const_QtPromisePrivate::PromiseError_&)> *local_88;
  function<void_(const_QtPromisePrivate::PromiseError_&)> *fn;
  pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *catcher;
  iterator local_70;
  iterator __end2;
  iterator __begin2;
  QVector<Catcher> *__range2;
  PromiseError error;
  undefined1 local_40 [8];
  QVector<Catcher> catchers;
  QVector<Handler> handlers;
  PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)> *this_local
  ;
  
  bVar1 = isPending(this);
  if (!bVar1) {
    QReadWriteLock::lockForWrite();
    QList<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
    ::QList((QList<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
             *)&catchers.d.size,&this->m_handlers);
    QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
    ::QList((QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
             *)local_40,&this->m_catchers);
    QReadWriteLock::unlock();
    bVar1 = PromiseError::isNull(&this->m_error);
    if (bVar1) {
      (*this->_vptr_PromiseDataBase[2])(this,&catchers.d.size);
      error.m_data._M_exception_object._0_4_ = 1;
    }
    else {
      PromiseError::PromiseError((PromiseError *)&__range2,&this->m_error);
      __end2 = QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
               ::begin((QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
                        *)local_40);
      local_70 = QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
                 ::end((QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
                        *)local_40);
      while( true ) {
        catcher = local_70.i;
        bVar1 = QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
                ::iterator::operator!=(&__end2,local_70);
        if (!bVar1) break;
        fn = (function<void_(const_QtPromisePrivate::PromiseError_&)> *)
             QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
             ::iterator::operator*(&__end2);
        local_88 = &((pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
                      *)fn)->second;
        std::function<void_(const_QtPromisePrivate::PromiseError_&)>::function
                  (&local_b0.fn,local_88);
        PromiseError::PromiseError(&local_b0.error,(PromiseError *)&__range2);
        qtpromise_defer<QtPromisePrivate::PromiseDataBase<(anonymous_namespace)::Foo,void((anonymous_namespace)::Foo_const&)>::dispatch()::_lambda()_1_>
                  (&local_b0,(QPointer<QThread> *)fn);
        PromiseDataBase<(anonymous_namespace)::Foo,void((anonymous_namespace)::Foo_const&)>::
        dispatch()::{lambda()#1}::~dispatch((_lambda___1_ *)&local_b0);
        QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
        ::iterator::operator++(&__end2);
      }
      PromiseError::~PromiseError((PromiseError *)&__range2);
      error.m_data._M_exception_object._0_4_ = 0;
    }
    QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
    ::~QList((QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
              *)local_40);
    QList<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
    ::~QList((QList<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
              *)&catchers.d.size);
  }
  return;
}

Assistant:

void dispatch()
    {
        if (isPending()) {
            return;
        }

        // A promise can't be resolved multiple times so once settled, its state can't
        // change. When fulfilled, handlers must be called (a single time) and catchers
        // ignored indefinitely (or vice-versa when the promise is rejected), so make
        // sure to clear both handlers AND catchers when dispatching. This also prevents
        // shared pointer circular reference memory leaks when the owning promise is
        // captured in the handler and/or catcher lambdas.

        m_lock.lockForWrite();
        QVector<Handler> handlers = std::move(m_handlers);
        QVector<Catcher> catchers = std::move(m_catchers);
        m_lock.unlock();

        if (m_error.isNull()) {
            notify(handlers);
            return;
        }

        PromiseError error = m_error;
        Q_ASSERT(!error.isNull());

        for (const auto& catcher : catchers) {
            const auto& fn = catcher.second;
            qtpromise_defer(
                [=]() {
                    fn(error);
                },
                catcher.first);
        }
    }